

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *fWarning_00;
  long lVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  Vec_Int_t *local_80;
  int *local_78;
  ulong local_60;
  
  piVar14 = vPart0->pArray;
  piVar7 = vPart1->pArray;
  iVar5 = vPart0->nSize;
  iVar3 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  if (0 < iVar3 && 0 < (long)iVar5) {
    piVar1 = piVar14 + iVar5;
    piVar2 = piVar7 + iVar3;
    do {
      lVar6 = (long)*piVar14;
      if ((lVar6 < 0) || (iVar5 = vCubes->nSize, iVar5 <= *piVar14)) {
LAB_0026788e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      fWarning_00 = vCubes->pArray;
      if (fWarning_00[lVar6].nSize < 1) {
LAB_002678ad:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar9 = (long)*piVar7;
      if ((lVar9 < 0) || (iVar5 <= *piVar7)) goto LAB_0026788e;
      if (fWarning_00[lVar9].nSize < 1) goto LAB_002678ad;
      iVar3 = *fWarning_00[lVar6].pArray;
      if (iVar3 == *fWarning_00[lVar9].pArray) {
        piVar12 = piVar14 + 1;
        pVVar10 = (Vec_Int_t *)0x1;
        local_60 = 1;
        if (piVar12 < piVar1) {
          do {
            uVar8 = (uint)pVVar10;
            lVar6 = (long)*piVar12;
            if ((lVar6 < 0) || (iVar5 <= *piVar12)) goto LAB_0026788e;
            if (fWarning_00[lVar6].nSize < 1) goto LAB_002678ad;
            if (iVar3 != *fWarning_00[lVar6].pArray) break;
            pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
            uVar8 = (uint)pVVar10;
            piVar12 = piVar12 + 1;
          } while (piVar12 < piVar1);
          pVVar10 = (Vec_Int_t *)(ulong)uVar8;
        }
        local_78 = piVar7 + 1;
        if (local_78 < piVar2) {
          local_60 = 1;
          do {
            lVar6 = (long)*local_78;
            if ((lVar6 < 0) || (iVar5 <= *local_78)) goto LAB_0026788e;
            if (fWarning_00[lVar6].nSize < 1) goto LAB_002678ad;
            if (iVar3 != *fWarning_00[lVar6].pArray) break;
            local_60 = local_60 + 1;
            local_78 = local_78 + 1;
          } while (local_78 < piVar2);
          local_60 = local_60 & 0xffffffff;
        }
        local_80 = (Vec_Int_t *)0x0;
        do {
          uVar13 = 0;
          do {
            uVar8 = piVar14[(long)local_80];
            uVar4 = piVar7[uVar13];
            if (uVar8 != uVar4) {
              if (((((int)uVar8 < 0) || (vCubes->nSize <= (int)uVar8)) || ((int)uVar4 < 0)) ||
                 (vCubes->nSize <= (int)uVar4)) goto LAB_0026788e;
              Fx_ManDivFindCubeFree
                        (vCubes->pArray + uVar8,vCubes->pArray + uVar4,vCubeFree,&fWarning_00->nCap)
              ;
              uVar8 = 0;
              if (vCubeFree->nSize == 4) {
                iVar5 = Fx_ManDivNormalize(vCubeFree);
                uVar8 = (uint)(iVar5 == 1);
              }
              uVar4 = vDiv->nSize;
              if (uVar4 == vCubeFree->nSize) {
                if (0 < (int)uVar4) {
                  fWarning_00 = (Vec_Int_t *)vDiv->pArray;
                  uVar11 = 0;
                  do {
                    if ((&fWarning_00->nCap)[uVar11] != vCubeFree->pArray[uVar11])
                    goto LAB_00267837;
                    uVar11 = uVar11 + 1;
                  } while (uVar4 != uVar11);
                }
                Vec_IntPush(vPairs,piVar14[(long)local_80]);
                Vec_IntPush(vPairs,piVar7[uVar13]);
                Vec_IntPush(vCompls,uVar8);
              }
            }
LAB_00267837:
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_60);
          fWarning_00 = (Vec_Int_t *)((long)&local_80->nCap + 1);
          local_80 = fWarning_00;
        } while (fWarning_00 != pVVar10);
      }
      else if (iVar3 < *fWarning_00[lVar9].pArray) {
        local_78 = piVar7;
        piVar12 = piVar14 + 1;
      }
      else {
        local_78 = piVar7 + 1;
        piVar12 = piVar14;
      }
    } while ((piVar12 < piVar1) && (piVar7 = local_78, piVar14 = piVar12, local_78 < piVar2));
  }
  return;
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}